

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwGetWindowSize(GLFWwindow *handle,int *width,int *height)

{
  _GLFWwindow *window;
  int *height_local;
  int *width_local;
  GLFWwindow *handle_local;
  
  if (handle != (GLFWwindow *)0x0) {
    if (width != (int *)0x0) {
      *width = 0;
    }
    if (height != (int *)0x0) {
      *height = 0;
    }
    if (_glfw.initialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
    }
    else {
      _glfwPlatformGetWindowSize((_GLFWwindow *)handle,width,height);
    }
    return;
  }
  __assert_fail("window != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/src/window.c"
                ,0x21b,"void glfwGetWindowSize(GLFWwindow *, int *, int *)");
}

Assistant:

GLFWAPI void glfwGetWindowSize(GLFWwindow* handle, int* width, int* height)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    if (width)
        *width = 0;
    if (height)
        *height = 0;

    _GLFW_REQUIRE_INIT();
    _glfwPlatformGetWindowSize(window, width, height);
}